

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_progress_bar_display.cpp
# Opt level: O1

void __thiscall
duckdb::TerminalProgressBarDisplay::Update(TerminalProgressBarDisplay *this,double percentage)

{
  int percentage_00;
  
  percentage_00 = 100;
  if ((percentage <= 100.0) && (percentage_00 = 0, 0.0 <= percentage)) {
    percentage_00 = (int)percentage;
  }
  if (percentage_00 != this->rendered_percentage) {
    PrintProgressInternal(this,percentage_00);
    Printer::Flush(STREAM_STDOUT);
    this->rendered_percentage = percentage_00;
  }
  return;
}

Assistant:

void TerminalProgressBarDisplay::Update(double percentage) {
	auto percentage_int = NormalizePercentage(percentage);
	if (percentage_int == rendered_percentage) {
		return;
	}
	PrintProgressInternal(percentage_int);
	Printer::Flush(OutputStream::STREAM_STDOUT);
	rendered_percentage = percentage_int;
}